

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O1

float Abc_NtkComputeFanoutLoad(Bus_Man_t *p,Vec_Ptr_t *vFanouts)

{
  int iVar1;
  long lVar2;
  long lVar3;
  float fVar4;
  
  fVar4 = Abc_SclFindWireLoad(p->vWireCaps,vFanouts->nSize);
  if (0 < (long)vFanouts->nSize) {
    lVar3 = 0;
    do {
      iVar1 = (int)*(long *)((long)vFanouts->pArray[lVar3] + 0x10);
      if (((long)iVar1 < 0) ||
         (lVar2 = *(long *)(*(long *)(*vFanouts->pArray[lVar3] + 0x168) + 0x38),
         *(int *)(lVar2 + 4) <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      fVar4 = fVar4 + *(float *)(*(long *)(lVar2 + 8) + (long)iVar1 * 4);
      lVar3 = lVar3 + 1;
    } while (vFanouts->nSize != lVar3);
  }
  return fVar4;
}

Assistant:

float Abc_NtkComputeFanoutLoad( Bus_Man_t * p, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    Load = Abc_SclFindWireLoad( p->vWireCaps, Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    return Load;
}